

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

int Llb_ManCutLiNum(Aig_Man_t *p,Vec_Ptr_t *vMinCut)

{
  int iVar1;
  int iFan;
  int iVar2;
  void *pvVar3;
  Aig_Obj_t *pObj;
  int i;
  uint uVar4;
  
  iFan = -1;
  i = 0;
  iVar1 = 0;
  do {
    if (vMinCut->nSize <= i) {
      return iVar1;
    }
    pvVar3 = Vec_PtrEntry(vMinCut,i);
    if ((*(uint *)((long)pvVar3 + 0x18) & 7) != 2) {
      if (p->pFanData == (int *)0x0) {
        __assert_fail("p->pFanData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Flow.c"
                      ,0x11a,"int Llb_ManCutLiNum(Aig_Man_t *, Vec_Ptr_t *)");
      }
      uVar4 = 0;
      do {
        if (*(uint *)((long)pvVar3 + 0x18) >> 6 <= uVar4) goto LAB_0068a98b;
        if (uVar4 == 0) {
          iFan = Aig_ObjFanout0Int(p,*(int *)((long)pvVar3 + 0x24));
        }
        else {
          iFan = Aig_ObjFanoutNext(p,iFan);
        }
        pObj = Aig_ManObj(p,iFan >> 1);
        iVar2 = Saig_ObjIsLi(p,pObj);
        uVar4 = uVar4 + 1;
      } while (iVar2 == 0);
      iVar1 = iVar1 + 1;
    }
LAB_0068a98b:
    i = i + 1;
  } while( true );
}

Assistant:

int Llb_ManCutLiNum( Aig_Man_t * p, Vec_Ptr_t * vMinCut )
{
    Aig_Obj_t * pFanout;
    Aig_Obj_t * pObj;
    int i, k, iFanout = -1, Counter = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMinCut, pObj, i )
    {
        if ( Aig_ObjIsCi(pObj) )
            continue;
        Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, k )
        {
            if ( Saig_ObjIsLi(p, pFanout) )
            {
                Counter++;
                break;
            }
        }
    }
    return Counter;
}